

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnBr(TypeChecker *this,Index depth)

{
  Result RVar1;
  Enum EVar2;
  Result RVar3;
  Label *in_RAX;
  TypeVector *sig;
  Label *label;
  Label *local_18;
  
  local_18 = in_RAX;
  RVar1 = GetLabel(this,depth,&local_18);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    sig = &local_18->result_types;
    if (local_18->label_type == Loop) {
      sig = &local_18->param_types;
    }
    RVar1 = CheckSignature(this,sig,"br");
    RVar3 = SetUnreachable(this);
    EVar2 = (Enum)(RVar3.enum_ == Error || RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result TypeChecker::OnBr(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  result |= CheckSignature(label->br_types(), "br");
  CHECK_RESULT(SetUnreachable());
  return result;
}